

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O3

int parseResultFromIoTHub(char *json_response,char **uploadCorrelationId,char **azureBlobSasUri)

{
  int iVar1;
  JSON_Value *value;
  JSON_Object *object;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  STRING_HANDLE handle;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var7;
  int iVar8;
  
  value = json_parse_string((char *)0x1277f6);
  if (value == (JSON_Value *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return 0xb5;
    }
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
              ,"parseResultFromIoTHub",0xb4,1,"unable to json_parse_string");
    return 0xb5;
  }
  object = json_value_get_object(value);
  if (object == (JSON_Object *)0x0) {
    p_Var7 = xlogging_get_log_function();
    iVar1 = 0xbd;
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
    pcVar2 = "unable to get json_value_get_object";
    iVar8 = 0xbc;
  }
  else {
    pcVar2 = json_object_get_string(object,"correlationId");
    if (pcVar2 == (char *)0x0) {
      p_Var7 = xlogging_get_log_function();
      iVar1 = 0xcb;
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
      pcVar2 = "unable to retrieve correlation Id from json";
      iVar8 = 0xca;
    }
    else {
      pcVar3 = json_object_get_string(object,"hostName");
      if (pcVar3 == (char *)0x0) {
        p_Var7 = xlogging_get_log_function();
        iVar1 = 0xd0;
        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
        pcVar2 = "unable to retrieve hostname Id from json";
        iVar8 = 0xcf;
      }
      else {
        pcVar4 = json_object_get_string(object,"containerName");
        if (pcVar4 == (char *)0x0) {
          p_Var7 = xlogging_get_log_function();
          iVar1 = 0xd5;
          if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
          pcVar2 = "unable to retrieve container name Id from json";
          iVar8 = 0xd4;
        }
        else {
          pcVar5 = json_object_get_string(object,"blobName");
          if (pcVar5 == (char *)0x0) {
            p_Var7 = xlogging_get_log_function();
            iVar1 = 0xda;
            if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
            pcVar2 = "unable to retrieve blob name Id from json";
            iVar8 = 0xd9;
          }
          else {
            pcVar6 = json_object_get_string(object,"sasToken");
            if (pcVar6 == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              iVar1 = 0xdf;
              if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
              pcVar2 = "unable to retrieve sas token from json";
              iVar8 = 0xde;
            }
            else {
              handle = URL_EncodeString(pcVar5);
              if (handle != (STRING_HANDLE)0x0) {
                handle_00 = STRING_new();
                if (handle_00 == (STRING_HANDLE)0x0) {
                  p_Var7 = xlogging_get_log_function();
                  iVar1 = 0xed;
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    (*p_Var7)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"parseResultFromIoTHub",0xec,1,
                              "Failed to allocate SAS URI STRING_HANDLE");
                  }
                }
                else {
                  pcVar5 = STRING_c_str(handle);
                  iVar1 = STRING_sprintf(handle_00,"https://%s/%s/%s%s",pcVar3,pcVar4,pcVar5,pcVar6)
                  ;
                  if (iVar1 == 0) {
                    iVar1 = mallocAndStrcpy_s(uploadCorrelationId,pcVar2);
                    if (iVar1 == 0) {
                      pcVar2 = STRING_c_str(handle_00);
                      iVar1 = mallocAndStrcpy_s(azureBlobSasUri,pcVar2);
                      if (iVar1 == 0) {
                        iVar1 = 0;
                      }
                      else {
                        p_Var7 = xlogging_get_log_function();
                        if (p_Var7 != (LOGGER_LOG)0x0) {
                          (*p_Var7)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                    ,"parseResultFromIoTHub",0xfd,1,"unable to copy SAS URI");
                        }
                        free(*uploadCorrelationId);
                        *uploadCorrelationId = (char *)0x0;
                        iVar1 = 0x100;
                      }
                    }
                    else {
                      p_Var7 = xlogging_get_log_function();
                      iVar1 = 0xf9;
                      if (p_Var7 != (LOGGER_LOG)0x0) {
                        (*p_Var7)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"parseResultFromIoTHub",0xf8,1,"unable to copy correlation Id");
                      }
                    }
                  }
                  else {
                    p_Var7 = xlogging_get_log_function();
                    iVar1 = 0xf4;
                    if (p_Var7 != (LOGGER_LOG)0x0) {
                      (*p_Var7)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                ,"parseResultFromIoTHub",0xf3,1,"unable to construct uri string");
                    }
                  }
                  STRING_delete(handle_00);
                }
                STRING_delete(handle);
                goto LAB_00127b0a;
              }
              p_Var7 = xlogging_get_log_function();
              iVar1 = 0xe4;
              if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00127b0a;
              pcVar2 = "unable to URL encode of filename";
              iVar8 = 0xe3;
            }
          }
        }
      }
    }
  }
  (*p_Var7)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"parseResultFromIoTHub",iVar8,1,pcVar2);
LAB_00127b0a:
  json_value_free(value);
  return iVar1;
}

Assistant:

static int parseResultFromIoTHub(const char* json_response, char** uploadCorrelationId, char** azureBlobSasUri)
{
    int result;
    JSON_Object* json_obj;
    JSON_Value* json = json_parse_string(json_response);

    if (json == NULL)
    {
        LogError("unable to json_parse_string");
        result = MU_FAILURE;

    }
    else
    {
        if ((json_obj = json_value_get_object(json)) == NULL)
        {
            LogError("unable to get json_value_get_object");
            result = MU_FAILURE;
        }
        else
        {
            const char* json_corr_id;
            const char* json_hostname;
            const char* json_container_name;
            const char* json_blob_name;
            const char* json_sas_token;
            STRING_HANDLE filename;

            if ((json_corr_id = json_object_get_string(json_obj, "correlationId")) == NULL)
            {
                LogError("unable to retrieve correlation Id from json");
                result = MU_FAILURE;
            }
            else if ((json_hostname = json_object_get_string(json_obj, "hostName")) == NULL)
            {
                LogError("unable to retrieve hostname Id from json");
                result = MU_FAILURE;
            }
            else if ((json_container_name = json_object_get_string(json_obj, "containerName")) == NULL)
            {
                LogError("unable to retrieve container name Id from json");
                result = MU_FAILURE;
            }
            else if ((json_blob_name = json_object_get_string(json_obj, "blobName")) == NULL)
            {
                LogError("unable to retrieve blob name Id from json");
                result = MU_FAILURE;
            }
            else if ((json_sas_token = json_object_get_string(json_obj, "sasToken")) == NULL)
            {
                LogError("unable to retrieve sas token from json");
                result = MU_FAILURE;
            }
            else if ((filename = URL_EncodeString(json_blob_name)) == NULL)
            {
                LogError("unable to URL encode of filename");
                result = MU_FAILURE;
            }
            else
            {
                STRING_HANDLE sas_uri;

                if ((sas_uri = STRING_new()) == NULL)
                {
                    LogError("Failed to allocate SAS URI STRING_HANDLE");
                    result = MU_FAILURE;
                }
                else
                {
                    if (STRING_sprintf(sas_uri, "https://%s/%s/%s%s", json_hostname, json_container_name, STRING_c_str(filename), json_sas_token) != 0)
                    {
                        LogError("unable to construct uri string");
                        result = MU_FAILURE;
                    }
                    else if (mallocAndStrcpy_s(uploadCorrelationId, json_corr_id) != 0)
                    {
                        LogError("unable to copy correlation Id");
                        result = MU_FAILURE;
                    }
                    else if (mallocAndStrcpy_s(azureBlobSasUri, STRING_c_str(sas_uri)) != 0)
                    {
                        LogError("unable to copy SAS URI");
                        free(*uploadCorrelationId);
                        *uploadCorrelationId = NULL;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                    
                    STRING_delete(sas_uri);
                }

                STRING_delete(filename);
            }
        }

        json_value_free(json);
    }

    return result;
}